

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

void __thiscall duckdb::Optimizer::RunBuiltInOptimizers(Optimizer *this)

{
  pointer pLVar1;
  uint uVar2;
  column_binding_map_t<unique_ptr<BaseStatistics>_> statistics_map;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(&this->plan);
  uVar2 = pLVar1->type - 0x85;
  if ((((0x39 < uVar2) || ((0x202400000000003U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
      (pLVar1->type != LOGICAL_EXTENSION_OPERATOR)) ||
     (pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(&this->plan),
     (pLVar1->children).
     super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
     .
     super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     (pLVar1->children).
     super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
     .
     super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:119:51)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:119:51)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,EXPRESSION_REWRITER,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:122:44)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:122:44)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,SUM_REWRITER,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:128:45)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:128:45)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,FILTER_PULLUP,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:134:47)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:134:47)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,FILTER_PUSHDOWN,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:142:49)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:142:49)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,CTE_FILTER_PUSHER,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:147:43)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:147:43)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,REGEX_RANGE,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:152:41)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:152:41)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,IN_CLAUSE,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:158:43)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:158:43)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,DELIMINATOR,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:164:51)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:164:51)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,EMPTY_RESULT_PULLUP,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:171:42)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:171:42)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,JOIN_ORDER,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:177:47)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:177:47)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,UNNEST_REWRITER,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:183:46)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:183:46)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,UNUSED_COLUMNS,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:189:48)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:189:48)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,DUPLICATE_GROUPS,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:195:53)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:195:53)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,COMMON_SUBEXPRESSIONS,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:201:47)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:201:47)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,COLUMN_LIFETIME,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:208:53)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:208:53)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,BUILD_SIDE_PROBE_SIDE,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:214:46)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:214:46)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,LIMIT_PUSHDOWN,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:220:49)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:220:49)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,SAMPLING_PUSHDOWN,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:226:37)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:226:37)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,TOP_N,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_bucket_count = 0;
    statistics_map._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:232:52)>
         ::_M_invoke;
    statistics_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:232:52)>
         ::_M_manager;
    statistics_map._M_h._M_buckets = (__buckets_ptr)this;
    RunOptimizer(this,LATE_MATERIALIZATION,(function<void_()> *)&statistics_map);
    ::std::_Function_base::~_Function_base((_Function_base *)&statistics_map);
    statistics_map._M_h._M_buckets = &statistics_map._M_h._M_single_bucket;
    statistics_map._M_h._M_bucket_count = 1;
    statistics_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    statistics_map._M_h._M_element_count = 0;
    statistics_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    statistics_map._M_h._M_rehash_policy._M_next_resize = 0;
    statistics_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_18 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:239:54)>
               ::_M_invoke;
    local_20 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:239:54)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    local_30._8_8_ = &statistics_map;
    RunOptimizer(this,STATISTICS_PROPAGATION,(function<void_()> *)&local_30);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
    local_30._8_8_ = 0;
    local_18 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:246:48)>
               ::_M_invoke;
    local_20 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:246:48)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    RunOptimizer(this,COMMON_AGGREGATE,(function<void_()> *)&local_30);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
    local_30._8_8_ = 0;
    local_18 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:252:47)>
               ::_M_invoke;
    local_20 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:252:47)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    RunOptimizer(this,COLUMN_LIFETIME,(function<void_()> *)&local_30);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
    local_30._8_8_ = 0;
    local_18 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:258:46)>
               ::_M_invoke;
    local_20 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:258:46)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    RunOptimizer(this,REORDER_FILTER,(function<void_()> *)&local_30);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
    local_30._8_8_ = 0;
    local_18 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:264:52)>
               ::_M_invoke;
    local_20 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:264:52)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    RunOptimizer(this,JOIN_FILTER_PUSHDOWN,(function<void_()> *)&local_30);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&statistics_map._M_h);
  }
  return;
}

Assistant:

void Optimizer::RunBuiltInOptimizers() {
	switch (plan->type) {
	case LogicalOperatorType::LOGICAL_TRANSACTION:
	case LogicalOperatorType::LOGICAL_PRAGMA:
	case LogicalOperatorType::LOGICAL_SET:
	case LogicalOperatorType::LOGICAL_UPDATE_EXTENSIONS:
	case LogicalOperatorType::LOGICAL_CREATE_SECRET:
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR:
		// skip optimizing simple & often-occurring plans unaffected by rewrites
		if (plan->children.empty()) {
			return;
		}
		break;
	default:
		break;
	}
	// first we perform expression rewrites using the ExpressionRewriter
	// this does not change the logical plan structure, but only simplifies the expression trees
	RunOptimizer(OptimizerType::EXPRESSION_REWRITER, [&]() { rewriter.VisitOperator(*plan); });

	// Rewrites SUM(x + C) into SUM(x) + C * COUNT(x)
	RunOptimizer(OptimizerType::SUM_REWRITER, [&]() {
		SumRewriterOptimizer optimizer(*this);
		optimizer.Optimize(plan);
	});

	// perform filter pullup
	RunOptimizer(OptimizerType::FILTER_PULLUP, [&]() {
		FilterPullup filter_pullup;
		plan = filter_pullup.Rewrite(std::move(plan));
	});

	// perform filter pushdown
	RunOptimizer(OptimizerType::FILTER_PUSHDOWN, [&]() {
		FilterPushdown filter_pushdown(*this);
		unordered_set<idx_t> top_bindings;
		filter_pushdown.CheckMarkToSemi(*plan, top_bindings);
		plan = filter_pushdown.Rewrite(std::move(plan));
	});

	// derive and push filters into materialized CTEs
	RunOptimizer(OptimizerType::CTE_FILTER_PUSHER, [&]() {
		CTEFilterPusher cte_filter_pusher(*this);
		plan = cte_filter_pusher.Optimize(std::move(plan));
	});

	RunOptimizer(OptimizerType::REGEX_RANGE, [&]() {
		RegexRangeFilter regex_opt;
		plan = regex_opt.Rewrite(std::move(plan));
	});

	RunOptimizer(OptimizerType::IN_CLAUSE, [&]() {
		InClauseRewriter ic_rewriter(context, *this);
		plan = ic_rewriter.Rewrite(std::move(plan));
	});

	// removes any redundant DelimGets/DelimJoins
	RunOptimizer(OptimizerType::DELIMINATOR, [&]() {
		Deliminator deliminator;
		plan = deliminator.Optimize(std::move(plan));
	});

	// Pulls up empty results
	RunOptimizer(OptimizerType::EMPTY_RESULT_PULLUP, [&]() {
		EmptyResultPullup empty_result_pullup;
		plan = empty_result_pullup.Optimize(std::move(plan));
	});

	// then we perform the join ordering optimization
	// this also rewrites cross products + filters into joins and performs filter pushdowns
	RunOptimizer(OptimizerType::JOIN_ORDER, [&]() {
		JoinOrderOptimizer optimizer(context);
		plan = optimizer.Optimize(std::move(plan));
	});

	// rewrites UNNESTs in DelimJoins by moving them to the projection
	RunOptimizer(OptimizerType::UNNEST_REWRITER, [&]() {
		UnnestRewriter unnest_rewriter;
		plan = unnest_rewriter.Optimize(std::move(plan));
	});

	// removes unused columns
	RunOptimizer(OptimizerType::UNUSED_COLUMNS, [&]() {
		RemoveUnusedColumns unused(binder, context, true);
		unused.VisitOperator(*plan);
	});

	// Remove duplicate groups from aggregates
	RunOptimizer(OptimizerType::DUPLICATE_GROUPS, [&]() {
		RemoveDuplicateGroups remove;
		remove.VisitOperator(*plan);
	});

	// then we extract common subexpressions inside the different operators
	RunOptimizer(OptimizerType::COMMON_SUBEXPRESSIONS, [&]() {
		CommonSubExpressionOptimizer cse_optimizer(binder);
		cse_optimizer.VisitOperator(*plan);
	});

	// creates projection maps so unused columns are projected out early
	RunOptimizer(OptimizerType::COLUMN_LIFETIME, [&]() {
		ColumnLifetimeAnalyzer column_lifetime(*this, *plan, true);
		column_lifetime.VisitOperator(*plan);
	});

	// Once we know the column lifetime, we have more information regarding
	// what relations should be the build side/probe side.
	RunOptimizer(OptimizerType::BUILD_SIDE_PROBE_SIDE, [&]() {
		BuildProbeSideOptimizer build_probe_side_optimizer(context, *plan);
		build_probe_side_optimizer.VisitOperator(*plan);
	});

	// pushes LIMIT below PROJECTION
	RunOptimizer(OptimizerType::LIMIT_PUSHDOWN, [&]() {
		LimitPushdown limit_pushdown;
		plan = limit_pushdown.Optimize(std::move(plan));
	});

	// perform sampling pushdown
	RunOptimizer(OptimizerType::SAMPLING_PUSHDOWN, [&]() {
		SamplingPushdown sampling_pushdown;
		plan = sampling_pushdown.Optimize(std::move(plan));
	});

	// transform ORDER BY + LIMIT to TopN
	RunOptimizer(OptimizerType::TOP_N, [&]() {
		TopN topn;
		plan = topn.Optimize(std::move(plan));
	});

	// try to use late materialization
	RunOptimizer(OptimizerType::LATE_MATERIALIZATION, [&]() {
		LateMaterialization late_materialization(*this);
		plan = late_materialization.Optimize(std::move(plan));
	});

	// perform statistics propagation
	column_binding_map_t<unique_ptr<BaseStatistics>> statistics_map;
	RunOptimizer(OptimizerType::STATISTICS_PROPAGATION, [&]() {
		StatisticsPropagator propagator(*this, *plan);
		propagator.PropagateStatistics(plan);
		statistics_map = propagator.GetStatisticsMap();
	});

	// remove duplicate aggregates
	RunOptimizer(OptimizerType::COMMON_AGGREGATE, [&]() {
		CommonAggregateOptimizer common_aggregate;
		common_aggregate.VisitOperator(*plan);
	});

	// creates projection maps so unused columns are projected out early
	RunOptimizer(OptimizerType::COLUMN_LIFETIME, [&]() {
		ColumnLifetimeAnalyzer column_lifetime(*this, *plan, true);
		column_lifetime.VisitOperator(*plan);
	});

	// apply simple expression heuristics to get an initial reordering
	RunOptimizer(OptimizerType::REORDER_FILTER, [&]() {
		ExpressionHeuristics expression_heuristics(*this);
		plan = expression_heuristics.Rewrite(std::move(plan));
	});

	// perform join filter pushdown after the dust has settled
	RunOptimizer(OptimizerType::JOIN_FILTER_PUSHDOWN, [&]() {
		JoinFilterPushdownOptimizer join_filter_pushdown(*this);
		join_filter_pushdown.VisitOperator(*plan);
	});
}